

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  long lVar7;
  xmlChar *pxVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  int max;
  int local_3c;
  xmlURIPtr local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  local_3c = 0x50;
  pxVar4 = (xmlChar *)(*xmlMalloc)(0x51);
  uVar12 = 0;
  if (pxVar4 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  pcVar1 = uri->scheme;
  local_38 = uri;
  if (pcVar1 != (char *)0x0) {
    if (*pcVar1 == '\0') {
      uVar17 = 0;
    }
    else {
      uVar11 = 0;
      do {
        pxVar6 = pxVar4;
        if (((long)local_3c <= (long)uVar11) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0015456d;
        uVar17 = uVar11 + 1;
        pxVar6[uVar11] = pcVar1[uVar11];
        lVar7 = uVar11 + 1;
        uVar11 = uVar17;
        pxVar4 = pxVar6;
      } while (pcVar1[lVar7] != '\0');
    }
    pxVar6 = pxVar4;
    if ((local_3c <= (int)uVar17) &&
       (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0)) goto LAB_0015456d;
    uVar12 = (int)uVar17 + 1;
    pxVar6[uVar17 & 0xffffffff] = ':';
    pxVar4 = pxVar6;
  }
  pbVar10 = (byte *)local_38->opaque;
  pxVar6 = pxVar4;
  if (pbVar10 == (byte *)0x0) {
    if ((local_38->server == (char *)0x0) && (local_38->port == 0)) {
      if (local_38->authority == (char *)0x0) {
        if (((local_38->scheme != (char *)0x0) && (local_3c <= (int)(uVar12 + 3))) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0015456d;
      }
      else {
        if ((local_3c <= (int)(uVar12 + 3)) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0015456d;
        (pxVar6 + (int)uVar12)[0] = '/';
        (pxVar6 + (int)uVar12)[1] = '/';
        uVar12 = uVar12 + 2;
        if (*local_38->authority != 0) {
          pxVar4 = pxVar6;
          pbVar10 = (byte *)local_38->authority;
          uVar9 = uVar12;
          do {
            pbVar16 = pbVar10 + 1;
            uVar12 = uVar9 + 3;
            pxVar6 = pxVar4;
            if ((local_3c <= (int)uVar12) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0015456d;
            bVar3 = *pbVar10;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x4000000096003fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              uVar12 = uVar9 + 1;
              uVar15 = uVar9;
            }
            else {
              pxVar6[(int)uVar9] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              uVar15 = uVar9 + 2;
              pxVar6[(long)(int)uVar9 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar6[(int)uVar15] = bVar3;
            pxVar4 = pxVar6;
            pbVar10 = pbVar16;
            uVar9 = uVar12;
          } while (*pbVar16 != 0);
        }
      }
    }
    else {
      if ((local_3c <= (int)(uVar12 + 3)) &&
         (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
      goto LAB_0015456d;
      (pxVar6 + (int)uVar12)[0] = '/';
      (pxVar6 + (int)uVar12)[1] = '/';
      uVar12 = uVar12 + 2;
      uVar17 = (ulong)uVar12;
      pbVar10 = (byte *)local_38->user;
      if (pbVar10 != (byte *)0x0) {
        if (*pbVar10 != 0) {
          pxVar4 = pxVar6;
          do {
            pbVar16 = pbVar10 + 1;
            iVar13 = (int)uVar17;
            uVar12 = iVar13 + 3;
            pxVar6 = pxVar4;
            if ((local_3c <= (int)uVar12) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0015456d;
            bVar3 = *pbVar10;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x4000000016003fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              uVar12 = iVar13 + 1;
              iVar14 = iVar13;
            }
            else {
              pxVar6[iVar13] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              iVar14 = iVar13 + 2;
              pxVar6[(long)iVar13 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar6[iVar14] = bVar3;
            uVar17 = (ulong)uVar12;
            pxVar4 = pxVar6;
            pbVar10 = pbVar16;
          } while (*pbVar16 != 0);
        }
        pxVar5 = pxVar6;
        if ((local_3c <= (int)(uVar12 + 3)) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0015456d;
        pxVar5[(int)uVar12] = '@';
        uVar17 = (ulong)(uVar12 + 1);
        pxVar6 = pxVar5;
      }
      pxVar5 = (xmlChar *)local_38->server;
      if ((pxVar5 != (xmlChar *)0x0) && (*pxVar5 != '\0')) {
        uVar17 = (ulong)(int)uVar17;
        pxVar4 = pxVar6;
        do {
          pxVar8 = pxVar5 + 1;
          pxVar6 = pxVar4;
          if (((long)local_3c <= (long)uVar17) &&
             (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
          goto LAB_0015456d;
          pxVar6[uVar17] = *pxVar5;
          uVar17 = uVar17 + 1;
          pxVar4 = pxVar6;
          pxVar5 = pxVar8;
        } while (*pxVar8 != '\0');
      }
      uVar12 = (uint)uVar17;
      if (0 < local_38->port) {
        pxVar5 = pxVar6;
        if ((local_3c <= (int)(uVar12 + 10)) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0015456d;
        iVar13 = snprintf((char *)(pxVar5 + (int)uVar12),(long)local_3c - (long)(int)uVar12,":%d",
                          (ulong)(uint)local_38->port);
        uVar12 = iVar13 + uVar12;
        pxVar6 = pxVar5;
      }
    }
    pbVar10 = (byte *)local_38->path;
    if (pbVar10 != (byte *)0x0) {
      if ((((xmlChar *)local_38->scheme != (xmlChar *)0x0) && (*pbVar10 == 0x2f)) &&
         (((byte)((pbVar10[1] & 0xdf) + 0xbf) < 0x1a &&
          ((pbVar10[2] == 0x3a &&
           (iVar13 = xmlStrEqual((xmlChar *)local_38->scheme,(xmlChar *)"file"), iVar13 != 0)))))) {
        pxVar5 = pxVar6;
        if ((local_3c <= (int)(uVar12 + 3)) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0015456d;
        pxVar5[(int)uVar12] = *pbVar10;
        pxVar5[(long)(int)uVar12 + 1] = pbVar10[1];
        pbVar16 = pbVar10 + 2;
        pbVar10 = pbVar10 + 3;
        pxVar5[(long)(int)uVar12 + 2] = *pbVar16;
        pxVar6 = pxVar5;
        uVar12 = uVar12 + 3;
      }
      bVar3 = *pbVar10;
      while (bVar3 != 0) {
        uVar9 = uVar12 + 3;
        pxVar5 = pxVar6;
        if ((local_3c <= (int)uVar9) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0)
           ) goto LAB_0015456d;
        bVar3 = *pbVar10;
        if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
           (((bVar3 - 0x21 < 0x3f &&
             ((0x4000000094007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) || (bVar3 == 0x7e))
           )) {
          uVar9 = uVar12 + 1;
          uVar15 = uVar12;
        }
        else {
          pxVar5[(int)uVar12] = '%';
          cVar2 = '0';
          if (0x9f < bVar3) {
            cVar2 = '7';
          }
          uVar15 = uVar12 + 2;
          pxVar5[(long)(int)uVar12 + 1] = cVar2 + (bVar3 >> 4);
          cVar2 = '0';
          if (9 < (bVar3 & 0xf)) {
            cVar2 = '7';
          }
          bVar3 = cVar2 + (bVar3 & 0xf);
        }
        pxVar5[(int)uVar15] = bVar3;
        bVar3 = pbVar10[1];
        pbVar10 = pbVar10 + 1;
        pxVar6 = pxVar5;
        uVar12 = uVar9;
      }
    }
    pxVar4 = pxVar6;
    if (local_38->query_raw == (char *)0x0) {
      if (local_38->query != (char *)0x0) {
        if ((local_3c <= (int)(uVar12 + 3)) &&
           (pxVar6 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar6 == (xmlChar *)0x0))
        goto LAB_0015456d;
        lVar7 = (long)(int)uVar12;
        uVar12 = uVar12 + 1;
        pxVar6[lVar7] = '?';
        if (*local_38->query != 0) {
          pxVar4 = pxVar6;
          pbVar10 = (byte *)local_38->query;
          uVar9 = uVar12;
          do {
            pbVar16 = pbVar10 + 1;
            uVar12 = uVar9 + 3;
            pxVar6 = pxVar4;
            if ((local_3c <= (int)uVar12) &&
               (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
            goto LAB_0015456d;
            bVar3 = *pbVar10;
            if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
               (((bVar3 - 0x21 < 0x3f &&
                 ((0x54000000d6007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) ||
                (bVar3 == 0x7e)))) {
              uVar12 = uVar9 + 1;
              uVar15 = uVar9;
            }
            else {
              pxVar6[(int)uVar9] = '%';
              cVar2 = '0';
              if (0x9f < bVar3) {
                cVar2 = '7';
              }
              uVar15 = uVar9 + 2;
              pxVar6[(long)(int)uVar9 + 1] = cVar2 + (bVar3 >> 4);
              cVar2 = '0';
              if (9 < (bVar3 & 0xf)) {
                cVar2 = '7';
              }
              bVar3 = cVar2 + (bVar3 & 0xf);
            }
            pxVar6[(int)uVar15] = bVar3;
            pxVar4 = pxVar6;
            pbVar10 = pbVar16;
            uVar9 = uVar12;
          } while (*pbVar16 != 0);
        }
      }
    }
    else {
      uVar9 = uVar12 + 1;
      if ((local_3c <= (int)uVar9) &&
         (pxVar6 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar6 == (xmlChar *)0x0))
      goto LAB_0015456d;
      pxVar6[(int)uVar12] = '?';
      uVar12 = uVar9;
      if (*local_38->query_raw != '\0') {
        pxVar4 = pxVar6;
        lVar7 = (long)(int)uVar9;
        pxVar5 = (xmlChar *)local_38->query_raw;
        do {
          pxVar8 = pxVar5 + 1;
          pxVar6 = pxVar4;
          if (((long)local_3c <= lVar7 + 1) &&
             (pxVar6 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar6 == (xmlChar *)0x0))
          goto LAB_0015456d;
          pxVar6[lVar7] = *pxVar5;
          uVar12 = uVar12 + 1;
          pxVar4 = pxVar6;
          lVar7 = lVar7 + 1;
          pxVar5 = pxVar8;
        } while (*pxVar8 != '\0');
      }
    }
  }
  else {
    bVar3 = *pbVar10;
    while (bVar3 != 0) {
      uVar9 = uVar12 + 3;
      pxVar5 = pxVar6;
      if ((local_3c <= (int)uVar9) &&
         (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0))
      goto LAB_0015456d;
      bVar3 = *pbVar10;
      if (((((bVar3 - 0x24 < 0x3a) &&
            ((0x28000001ac00985U >> ((ulong)(bVar3 - 0x24) & 0x3f) & 1) != 0)) ||
           (((byte)(bVar3 - 0x30) < 10 || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)))) ||
          ((bVar3 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)))) || (bVar3 == 0x7e))
      {
        uVar9 = uVar12 + 1;
        iVar13 = uVar12;
      }
      else {
        pxVar5[(int)uVar12] = '%';
        cVar2 = '0';
        if (0x9f < bVar3) {
          cVar2 = '7';
        }
        iVar13 = uVar12 + 2;
        pxVar5[(long)(int)uVar12 + 1] = cVar2 + (bVar3 >> 4);
        cVar2 = '0';
        if (9 < (bVar3 & 0xf)) {
          cVar2 = '7';
        }
        bVar3 = cVar2 + (bVar3 & 0xf);
      }
      pxVar5[iVar13] = bVar3;
      bVar3 = pbVar10[1];
      pbVar10 = pbVar10 + 1;
      pxVar6 = pxVar5;
      uVar12 = uVar9;
    }
  }
  pxVar5 = pxVar6;
  if (local_38->fragment != (char *)0x0) {
    if ((local_3c <= (int)(uVar12 + 3)) &&
       (pxVar5 = xmlSaveUriRealloc(pxVar6,&local_3c), pxVar4 = pxVar6, pxVar5 == (xmlChar *)0x0))
    goto LAB_0015456d;
    lVar7 = (long)(int)uVar12;
    uVar12 = uVar12 + 1;
    pxVar5[lVar7] = '#';
    if (*local_38->fragment != 0) {
      pxVar4 = pxVar5;
      pbVar10 = (byte *)local_38->fragment;
      do {
        pbVar16 = pbVar10 + 1;
        pxVar5 = pxVar4;
        if ((local_3c <= (int)(uVar12 + 3)) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar5 == (xmlChar *)0x0))
        goto LAB_0015456d;
        bVar3 = *pbVar10;
        if ((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
           (((bVar3 - 0x21 < 0x3f &&
             ((0x54000000d6007fe9U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) != 0)) || (bVar3 == 0x7e))
           )) {
          uVar9 = uVar12;
          uVar12 = uVar12 + 1;
        }
        else {
          pxVar5[(int)uVar12] = '%';
          cVar2 = '0';
          if (0x9f < bVar3) {
            cVar2 = '7';
          }
          uVar9 = uVar12 + 2;
          pxVar5[(long)(int)uVar12 + 1] = cVar2 + (bVar3 >> 4);
          cVar2 = '0';
          if (9 < (bVar3 & 0xf)) {
            cVar2 = '7';
          }
          bVar3 = cVar2 + (bVar3 & 0xf);
          uVar12 = uVar12 + 3;
        }
        pxVar5[(int)uVar9] = bVar3;
        pxVar4 = pxVar5;
        pbVar10 = pbVar16;
      } while (*pbVar16 != 0);
    }
  }
  pxVar6 = pxVar5;
  if (((int)uVar12 < local_3c) ||
     (pxVar6 = xmlSaveUriRealloc(pxVar5,&local_3c), pxVar4 = pxVar5, pxVar6 != (xmlChar *)0x0)) {
    pxVar6[(int)uVar12] = '\0';
    return pxVar6;
  }
LAB_0015456d:
  (*xmlFree)(pxVar4);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = xmlMalloc(max + 1);
    if (ret == NULL)
	return(NULL);
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port != PORT_EMPTY)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
                    /* TODO: escaping? */
		    ret[len++] = (xmlChar) *p++;
		}
	    }
            if (uri->port > 0) {
                if (len + 10 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
                }
                len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
            }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}